

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# request.c
# Opt level: O3

void h2o_delegate_request(h2o_req_t *req,h2o_handler_t *current_handler)

{
  uint64_t *puVar1;
  size_t sVar2;
  h2o_handler_t **pphVar3;
  h2o_handler_t **pphVar4;
  int iVar5;
  long lVar6;
  h2o_handler_t **pphVar7;
  
  pphVar7 = (req->pathconf->handlers).entries;
  sVar2 = (req->pathconf->handlers).size;
  if (sVar2 != 0) {
    pphVar3 = pphVar7 + sVar2;
    lVar6 = sVar2 << 3;
    pphVar4 = pphVar7;
    while (pphVar7 = pphVar4 + 1, *pphVar4 != current_handler) {
      lVar6 = lVar6 + -8;
      pphVar4 = pphVar7;
      if (lVar6 == 0) {
        call_handlers(req,pphVar3);
        return;
      }
    }
  }
  sVar2 = (req->pathconf->handlers).size;
  pphVar3 = (req->pathconf->handlers).entries;
  while( true ) {
    if (pphVar3 + sVar2 == pphVar7) {
      puVar1 = req->conn->ctx->emitted_error_status + 2;
      *puVar1 = *puVar1 + 1;
      h2o_send_error_generic(req,0x194,"File Not Found","not found",0);
      return;
    }
    iVar5 = (*(*pphVar7)->on_req)(*pphVar7,req);
    if (iVar5 == 0) break;
    pphVar7 = pphVar7 + 1;
  }
  return;
}

Assistant:

void h2o_delegate_request(h2o_req_t *req, h2o_handler_t *current_handler)
{
    h2o_handler_t **handler = req->pathconf->handlers.entries, **end = handler + req->pathconf->handlers.size;

    for (; handler != end; ++handler) {
        if (*handler == current_handler) {
            ++handler;
            break;
        }
    }
    call_handlers(req, handler);
}